

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse2.c
# Opt level: O2

void aom_dc_top_predictor_8x4_sse2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  uint uVar1;
  uint6 uVar2;
  ulong uVar3;
  undefined1 auVar4 [11];
  undefined1 auVar5 [13];
  int iVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  ushort uVar9;
  ushort uVar16;
  ushort uVar18;
  ushort uVar19;
  undefined1 auVar10 [16];
  ushort uVar20;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 uVar15;
  byte bVar17;
  
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)above;
  auVar10 = psadbw((undefined1  [16])0x0,auVar8);
  uVar9 = auVar10._0_2_ + 4;
  uVar16 = auVar10._2_2_ + 4;
  uVar18 = auVar10._4_2_ + 4;
  uVar19 = auVar10._6_2_ + 4;
  auVar11._0_2_ = uVar9 >> 3;
  uVar20 = uVar19 >> 3;
  uVar1 = CONCAT22((ushort)(auVar10._8_2_ + 4U) >> 3,uVar20);
  auVar12._0_9_ = (unkuint9)uVar1 << 0x30;
  uVar2 = CONCAT24((ushort)(auVar10._10_2_ + 4U) >> 3,uVar1);
  auVar4._6_5_ = 0;
  auVar4._0_6_ = uVar2;
  auVar13._0_11_ = auVar4 << 0x30;
  uVar3 = CONCAT26((ushort)(auVar10._12_2_ + 4U) >> 3,uVar2);
  auVar5._8_5_ = 0;
  auVar5._0_8_ = uVar3;
  auVar14._0_13_ = auVar5 << 0x30;
  bVar17 = (byte)(uVar19 >> 8);
  auVar14._14_2_ = (undefined2)(CONCAT19(bVar17 >> 3,CONCAT18(bVar17 >> 3,uVar3)) >> 0x40);
  auVar14[0xd] = (char)uVar20;
  bVar17 = (byte)(uVar18 >> 0xb);
  auVar13._12_4_ = (undefined4)(CONCAT37(auVar14._13_3_,CONCAT16((char)uVar20,uVar2)) >> 0x30);
  auVar13[0xb] = bVar17;
  uVar15 = (undefined1)(uVar18 >> 3);
  auVar12._10_6_ = (undefined6)(CONCAT55(auVar13._11_5_,CONCAT14(bVar17,uVar1)) >> 0x20);
  auVar12[9] = uVar15;
  bVar17 = (byte)(uVar16 >> 0xb);
  auVar11._8_8_ = (undefined8)(CONCAT73(auVar12._9_7_,CONCAT12(uVar15,uVar20)) >> 0x10);
  auVar11[7] = bVar17;
  auVar11[6] = bVar17;
  uVar15 = (undefined1)(uVar16 >> 3);
  auVar11[5] = uVar15;
  auVar11[4] = uVar15;
  bVar17 = (byte)(uVar9 >> 8);
  auVar11[3] = bVar17 >> 3;
  auVar11[2] = bVar17 >> 3;
  auVar10[0] = (undefined1)auVar11._0_2_;
  auVar10._2_14_ = auVar11._2_14_;
  auVar10[1] = auVar10[0];
  auVar8 = pshuflw(auVar8,auVar10,0);
  iVar6 = 4;
  while (bVar7 = iVar6 != 0, iVar6 = iVar6 + -1, bVar7) {
    *(long *)dst = auVar8._0_8_;
    dst = dst + stride;
  }
  return;
}

Assistant:

void aom_dc_top_predictor_8x4_sse2(uint8_t *dst, ptrdiff_t stride,
                                   const uint8_t *above, const uint8_t *left) {
  (void)left;
  __m128i sum_above = dc_sum_8(above);
  const __m128i four = _mm_set1_epi16(4);
  sum_above = _mm_add_epi16(sum_above, four);
  sum_above = _mm_srai_epi16(sum_above, 3);
  sum_above = _mm_unpacklo_epi8(sum_above, sum_above);
  const __m128i row = _mm_shufflelo_epi16(sum_above, 0);
  dc_store_8xh(&row, 4, dst, stride);
}